

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

void lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  lu_byte lVar1;
  lua_Hook p_Var2;
  
  if ((L->hook != (lua_Hook)0x0) && (L->l_G->ravi_debugger_data != (void *)0x0)) {
    return;
  }
  p_Var2 = func;
  if (mask == 0) {
    p_Var2 = (lua_Hook)0x0;
  }
  if ((L->ci->callstatus & 2) != 0) {
    L->oldpc = (L->ci->u).l.savedpc;
  }
  L->hook = p_Var2;
  L->basehookcount = count;
  L->hookcount = count;
  lVar1 = (lu_byte)mask;
  if (func == (lua_Hook)0x0) {
    lVar1 = '\0';
  }
  L->hookmask = lVar1;
  return;
}

Assistant:

LUA_API void lua_sethook (lua_State *L, lua_Hook func, int mask, int count) {
  /* Ravi change - disable setting of hook if debugger is running the Lua instance */
  global_State *G = G(L);
  if (L->hook != NULL && G->ravi_debugger_data != NULL)
    return;
  if (func == NULL || mask == 0) {  /* turn off hooks? */
    mask = 0;
    func = NULL;
  }
  if (isLua(L->ci))
    L->oldpc = L->ci->u.l.savedpc;
  L->hook = func;
  L->basehookcount = count;
  resethookcount(L);
  L->hookmask = cast_byte(mask);
}